

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-visuals.c
# Opt level: O2

void visuals_cycler_set_cycle_for_race(monster_race *race,char *group_name,char *cycle_name)

{
  uint uVar1;
  visuals_cycler *cycler;
  undefined4 in_EAX;
  int iVar2;
  visuals_color_cycle **ppvVar3;
  visuals_color_cycle *pvVar4;
  ulong uVar5;
  anon_struct_24_3_6ed953bc *paVar6;
  undefined1 auVar7 [16];
  
  cycler = visuals_cycler_table;
  auVar7._0_4_ = -(uint)(race == (monster_race *)0x0);
  auVar7._4_4_ = -(uint)(group_name == (char *)0x0);
  auVar7._8_4_ = -(uint)(cycle_name == (char *)0x0);
  auVar7._12_4_ = -(uint)(visuals_color_cycles_by_race == (anon_struct_24_3_6ed953bc *)0x0);
  iVar2 = movmskps(in_EAX,auVar7);
  paVar6 = visuals_color_cycles_by_race;
  if (iVar2 == 0) {
    while( true ) {
      uVar1 = race->ridx;
      if ((ulong)uVar1 < paVar6->max_entries) break;
      uVar5 = paVar6->max_entries + paVar6->alloc_size;
      ppvVar3 = (visuals_color_cycle **)mem_realloc(paVar6->race,uVar5 * 8);
      visuals_color_cycles_by_race->race = ppvVar3;
      paVar6 = visuals_color_cycles_by_race;
      visuals_color_cycles_by_race->max_entries = uVar5;
      if (9999 < uVar5) {
        quit("Allocated too many color cycle/race refs. Check monster info?");
        paVar6 = visuals_color_cycles_by_race;
      }
    }
    pvVar4 = visuals_cycler_cycle_by_name(cycler,group_name,cycle_name);
    if (pvVar4 != (visuals_color_cycle *)0x0) {
      paVar6->race[uVar1] = pvVar4;
    }
  }
  return;
}

Assistant:

void visuals_cycler_set_cycle_for_race(struct monster_race const *race,
									   const char *group_name,
									   const char *cycle_name)
{
	struct visuals_cycler *table = visuals_cycler_table;
	struct visuals_color_cycle *cycle = NULL;

	if (race == NULL || group_name == NULL || cycle_name == NULL) {
		return;
	}

	if (visuals_color_cycles_by_race == NULL) {
		return;
	}

	while (race->ridx >= visuals_color_cycles_by_race->max_entries) {
		/* Keep reallocating until we can fit the index. This for the case when
		 * indexes may not be parsed in numerical order. */
		size_t old_count = visuals_color_cycles_by_race->max_entries;
		size_t new_count = old_count + visuals_color_cycles_by_race->alloc_size;
		size_t new_size = new_count * sizeof(*(visuals_color_cycles_by_race->race));
		visuals_color_cycles_by_race->race = mem_realloc(visuals_color_cycles_by_race->race, new_size);
		visuals_color_cycles_by_race->max_entries = new_count;

		if (new_count >= 10000) {
			/* Prevent the list from growing to a ridiculous size. */
			quit("Allocated too many color cycle/race refs. Check monster info?");
		}
	}

	cycle = visuals_cycler_cycle_by_name(table, group_name, cycle_name);

	if (cycle == NULL) {
		return;
	}

	visuals_color_cycles_by_race->race[race->ridx] = cycle;
}